

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall JsonString_FourFs_Test::~JsonString_FourFs_Test(JsonString_FourFs_Test *this)

{
  anon_unknown.dwarf_1a1265::JsonString::~JsonString(&this->super_JsonString);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, FourFs) {
    // Note that there is no unicode code-point at U+FFFF.
    EXPECT_CALL (callbacks_, string_value ("\xEF\xBF\xBF")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input ("\"\\uFFFF\"").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{9U, 1U}));
}